

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O3

void __thiscall
gmlc::containers::
StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::freeAll(StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  if (this->dataptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
    lVar7 = (long)this->bsize;
    if (0 < lVar7) {
      uVar8 = lVar7 + 1;
      lVar7 = lVar7 * 0x20 + -0x10;
      do {
        plVar2 = *(long **)((long)this->dataptr[this->dataSlotIndex] + lVar7 + -0x10);
        plVar4 = (long *)((long)&(this->dataptr[this->dataSlotIndex]->_M_dataplus)._M_p + lVar7);
        if (plVar4 != plVar2) {
          operator_delete(plVar2,*plVar4 + 1);
        }
        uVar8 = uVar8 - 1;
        lVar7 = lVar7 + -0x20;
      } while (1 < uVar8);
    }
    iVar6 = this->dataSlotIndex;
    if (0 < (long)iVar6) {
      operator_delete(this->dataptr[iVar6],0x400);
      iVar6 = this->dataSlotIndex;
      lVar7 = (long)iVar6;
      if (0 < (long)iVar6) {
        do {
          lVar1 = lVar7 + -1;
          lVar5 = 0;
          do {
            plVar4 = (long *)(this->dataptr[lVar1][0x1f].field_2._M_local_buf + lVar5);
            plVar2 = *(long **)((long)&this->dataptr[lVar1][0x1f]._M_dataplus._M_p + lVar5);
            if (plVar4 != plVar2) {
              operator_delete(plVar2,*plVar4 + 1);
            }
            lVar5 = lVar5 + -0x20;
          } while (lVar5 != -0x400);
          operator_delete(this->dataptr[lVar1],0x400);
          bVar3 = 1 < lVar7;
          lVar7 = lVar1;
        } while (bVar3);
        iVar6 = this->dataSlotIndex;
      }
    }
    if (iVar6 == 0) {
      operator_delete(*this->dataptr,0x400);
    }
    if (0 < this->freeIndex) {
      lVar7 = 0;
      do {
        operator_delete(this->freeblocks[lVar7],0x400);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->freeIndex);
    }
    if (this->freeblocks !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
      operator_delete__(this->freeblocks);
    }
    if (this->dataptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0)
    {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }